

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O2

int parse_switches(j_decompress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,
                  boolean for_real)

{
  int *piVar1;
  j_decompress_ptr pjVar2;
  boolean bVar3;
  int iVar4;
  FILE *__stream;
  long lVar5;
  int iVar6;
  char *arg;
  bool bVar7;
  char ch;
  j_decompress_ptr local_60;
  char c;
  int local_50;
  int val;
  uint *local_48;
  uint *local_40;
  long local_38;
  
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  memsrc = 0;
  report = 0;
  skip = 0;
  requested_fmt = FMT_PPM;
  crop = 0;
  strict = 0;
  cinfo->err->trace_level = 0;
  local_40 = &cinfo->scale_num;
  local_48 = &cinfo->scale_denom;
  iVar6 = 1;
  local_60 = cinfo;
  local_50 = last_file_arg_seen;
  do {
    if (argc <= iVar6) {
      return iVar6;
    }
    if (*argv[iVar6] == '-') {
      arg = argv[iVar6] + 1;
      bVar3 = keymatch(arg,"bmp",1);
      if (bVar3 == 0) {
        bVar3 = keymatch(arg,"colors",1);
        if ((((bVar3 == 0) && (bVar3 = keymatch(arg,"colours",1), bVar3 == 0)) &&
            (bVar3 = keymatch(arg,"quantize",1), bVar3 == 0)) &&
           (bVar3 = keymatch(arg,"quantise",1), bVar3 == 0)) {
          bVar3 = keymatch(arg,"dct",2);
          if (bVar3 == 0) {
            bVar3 = keymatch(arg,"dither",2);
            if (bVar3 == 0) {
              bVar3 = keymatch(arg,"debug",1);
              if ((bVar3 == 0) && (bVar3 = keymatch(arg,"verbose",1), bVar3 == 0)) {
                bVar3 = keymatch(arg,"version",4);
                if (bVar3 != 0) goto LAB_001064e8;
                bVar3 = keymatch(arg,"fast",1);
                if (bVar3 == 0) {
                  bVar3 = keymatch(arg,"gif",1);
                  if (bVar3 == 0) {
                    bVar3 = keymatch(arg,"gif0",4);
                    if (bVar3 == 0) {
                      bVar3 = keymatch(arg,"grayscale",2);
                      if ((bVar3 == 0) && (bVar3 = keymatch(arg,"greyscale",2), bVar3 == 0)) {
                        bVar3 = keymatch(arg,"rgb",2);
                        if (bVar3 == 0) {
                          bVar3 = keymatch(arg,"rgb565",2);
                          if (bVar3 == 0) {
                            bVar3 = keymatch(arg,"icc",1);
                            if (bVar3 == 0) {
                              bVar3 = keymatch(arg,"map",3);
                              if (bVar3 == 0) {
                                bVar3 = keymatch(arg,"maxmemory",3);
                                if (bVar3 == 0) {
                                  bVar3 = keymatch(arg,"maxscans",4);
                                  if (bVar3 == 0) {
                                    bVar3 = keymatch(arg,"nosmooth",3);
                                    if (bVar3 == 0) {
                                      bVar3 = keymatch(arg,"onepass",3);
                                      if (bVar3 == 0) {
                                        bVar3 = keymatch(arg,"os2",3);
                                        if (bVar3 == 0) {
                                          bVar3 = keymatch(arg,"outfile",4);
                                          if (bVar3 == 0) {
                                            bVar3 = keymatch(arg,"memsrc",2);
                                            if (bVar3 == 0) {
                                              bVar3 = keymatch(arg,"pnm",1);
                                              if ((bVar3 == 0) &&
                                                 (bVar3 = keymatch(arg,"ppm",1), bVar3 == 0)) {
                                                bVar3 = keymatch(arg,"report",2);
                                                if (bVar3 == 0) {
                                                  bVar3 = keymatch(arg,"scale",2);
                                                  if (bVar3 != 0) {
                                                    if (iVar6 + 1 < argc) {
                                                      iVar4 = __isoc99_sscanf(argv[iVar6 + 1],
                                                                              "%u/%u",local_40,
                                                                              local_48);
                                                      bVar7 = iVar4 == 2;
                                                      goto LAB_0010620e;
                                                    }
                                                    goto LAB_001064e3;
                                                  }
                                                  bVar3 = keymatch(arg,"skip",2);
                                                  if (bVar3 == 0) {
                                                    bVar3 = keymatch(arg,"crop",2);
                                                    if (bVar3 == 0) {
                                                      bVar3 = keymatch(arg,"strict",2);
                                                      if (bVar3 == 0) {
                                                        bVar3 = keymatch(arg,"targa",1);
                                                        if (bVar3 == 0) goto LAB_001064e3;
                                                        requested_fmt = FMT_TARGA;
                                                      }
                                                      else {
                                                        strict = 1;
                                                      }
                                                    }
                                                    else {
                                                      iVar6 = iVar6 + 1;
                                                      if ((((argc <= iVar6) ||
                                                           (iVar4 = __isoc99_sscanf(argv[iVar6],
                                                                                    "%u%c%u+%u+%u",
                                                                                    &crop_width,&c,
                                                                                    &crop_height,
                                                                                    &crop_x,&crop_y)
                                                           , iVar4 != 5)) || ((c & 0xdfU) != 0x58))
                                                         || ((crop_width == 0 || (crop_height == 0))
                                                            )) goto LAB_001064e3;
                                                      crop = 1;
                                                    }
                                                  }
                                                  else {
                                                    iVar6 = iVar6 + 1;
                                                    if (((argc <= iVar6) ||
                                                        (iVar4 = __isoc99_sscanf(argv[iVar6],"%u,%u"
                                                                                 ,&skip_start,
                                                                                 &skip_end),
                                                        iVar4 != 2)) || (skip_end < skip_start))
                                                    goto LAB_001064e3;
                                                    skip = 1;
                                                  }
                                                }
                                                else {
                                                  report = 1;
                                                }
                                              }
                                              else {
                                                requested_fmt = FMT_PPM;
                                              }
                                            }
                                            else {
                                              memsrc = 1;
                                            }
                                          }
                                          else {
                                            iVar6 = iVar6 + 1;
                                            if (argc <= iVar6) goto LAB_001064e3;
                                            outfilename = argv[iVar6];
                                          }
                                        }
                                        else {
                                          requested_fmt = FMT_OS2;
                                        }
                                      }
                                      else {
                                        local_60->two_pass_quantize = 0;
                                      }
                                    }
                                    else {
                                      local_60->do_fancy_upsampling = 0;
                                    }
                                    goto LAB_00105d5d;
                                  }
                                  if (iVar6 + 1 < argc) {
                                    iVar4 = __isoc99_sscanf(argv[iVar6 + 1],"%u",&max_scans);
                                    bVar7 = iVar4 == 1;
LAB_0010620e:
                                    iVar6 = iVar6 + 1;
                                    if (bVar7) goto LAB_00105d5d;
                                  }
                                }
                                else {
                                  ch = 'x';
                                  iVar6 = iVar6 + 1;
                                  if ((iVar6 < argc) &&
                                     (iVar4 = __isoc99_sscanf(argv[iVar6],"%ld%c",&local_38,&ch),
                                     0 < iVar4)) {
                                    lVar5 = local_38 * 1000;
                                    if ((ch & 0xdfU) != 0x4d) {
                                      lVar5 = local_38;
                                    }
                                    local_60->mem->max_memory_to_use = lVar5 * 1000;
                                    goto LAB_00105d5d;
                                  }
                                }
                              }
                              else {
                                iVar6 = iVar6 + 1;
                                if (iVar6 < argc) {
                                  if (local_50 != 0) {
                                    __stream = fopen(argv[iVar6],"rb");
                                    pjVar2 = local_60;
                                    if (__stream == (FILE *)0x0) {
                                      fprintf(_stderr,"%s: can\'t open %s\n",progname,argv[iVar6]);
                                      exit(1);
                                    }
                                    read_color_map(local_60,(FILE *)__stream);
                                    fclose(__stream);
                                    pjVar2->quantize_colors = 1;
                                  }
                                  goto LAB_00105d5d;
                                }
                              }
                            }
                            else {
                              iVar6 = iVar6 + 1;
                              if (iVar6 < argc) {
                                icc_filename = argv[iVar6];
                                jpeg_save_markers(local_60,0xe2,0xffff);
                                goto LAB_00105d5d;
                              }
                            }
LAB_001064e3:
                            usage();
LAB_001064e8:
                            fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1",
                                    "20250502");
                            exit(0);
                          }
                          local_60->out_color_space = JCS_RGB565;
                        }
                        else {
                          local_60->out_color_space = JCS_RGB;
                        }
                      }
                      else {
                        local_60->out_color_space = JCS_GRAYSCALE;
                      }
                    }
                    else {
                      requested_fmt = FMT_GIF0;
                    }
                  }
                  else {
                    requested_fmt = FMT_GIF;
                  }
                }
                else {
                  local_60->dither_mode = JDITHER_ORDERED;
                  local_60->two_pass_quantize = 0;
                  if (local_60->quantize_colors == 0) {
                    local_60->desired_number_of_colors = 0xd8;
                  }
                  local_60->dct_method = JDCT_IFAST;
                  local_60->do_fancy_upsampling = 0;
                }
              }
              else {
                if (parse_switches_printed_version == '\0') {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  fprintf(_stderr,"%s\n\n",
                          "Copyright (C) 2009-2021 D. R. Commander\nCopyright (C) 2015, 2020 Google, Inc.\nCopyright (C) 2019-2020 Arm Limited\nCopyright (C) 2015-2016, 2018 Matthieu Darbois\nCopyright (C) 2011-2016 Siarhei Siamashka\nCopyright (C) 2015 Intel Corporation\nCopyright (C) 2013-2014 Linaro Limited\nCopyright (C) 2013-2014 MIPS Technologies, Inc.\nCopyright (C) 2009, 2012 Pierre Ossman for Cendio AB\nCopyright (C) 2009-2011 Nokia Corporation and/or its subsidiary(-ies)\nCopyright (C) 1999-2006 MIYASAKA Masaru\nCopyright (C) 1991-2020 Thomas G. Lane, Guido Vollbeding"
                         );
                  fprintf(_stderr,"Emulating The Independent JPEG Group\'s software, version %s\n\n"
                          ,"6b  27-Mar-1998");
                  parse_switches_printed_version = '\x01';
                }
                piVar1 = &local_60->err->trace_level;
                *piVar1 = *piVar1 + 1;
              }
            }
            else {
              iVar6 = iVar6 + 1;
              if (argc <= iVar6) goto LAB_001064e3;
              bVar3 = keymatch(argv[iVar6],"fs",2);
              if (bVar3 == 0) {
                bVar3 = keymatch(argv[iVar6],"none",2);
                if (bVar3 == 0) {
                  bVar3 = keymatch(argv[iVar6],"ordered",2);
                  if (bVar3 == 0) goto LAB_001064e3;
                  local_60->dither_mode = JDITHER_ORDERED;
                }
                else {
                  local_60->dither_mode = JDITHER_NONE;
                }
              }
              else {
                local_60->dither_mode = JDITHER_FS;
              }
            }
          }
          else {
            iVar6 = iVar6 + 1;
            if (argc <= iVar6) goto LAB_001064e3;
            bVar3 = keymatch(argv[iVar6],"int",1);
            if (bVar3 == 0) {
              bVar3 = keymatch(argv[iVar6],"fast",2);
              if (bVar3 == 0) {
                bVar3 = keymatch(argv[iVar6],"float",2);
                if (bVar3 == 0) goto LAB_001064e3;
                local_60->dct_method = JDCT_FLOAT;
              }
              else {
                local_60->dct_method = JDCT_IFAST;
              }
            }
            else {
              local_60->dct_method = JDCT_ISLOW;
            }
          }
        }
        else {
          iVar6 = iVar6 + 1;
          if ((argc <= iVar6) || (iVar4 = __isoc99_sscanf(argv[iVar6],"%d",&val), iVar4 != 1))
          goto LAB_001064e3;
          local_60->desired_number_of_colors = val;
          local_60->quantize_colors = 1;
        }
      }
      else {
        requested_fmt = FMT_BMP;
      }
    }
    else {
      if (0 < iVar6) {
        return iVar6;
      }
      outfilename = (char *)0x0;
    }
LAB_00105d5d:
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

LOCAL(int)
parse_switches(j_decompress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;

  /* Set up default JPEG parameters. */
  requested_fmt = DEFAULT_FMT;  /* set default output file format */
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  memsrc = FALSE;
  report = FALSE;
  skip = FALSE;
  crop = FALSE;
  strict = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "bmp", 1)) {
      /* BMP output format (Windows flavor). */
      requested_fmt = FMT_BMP;

    } else if (keymatch(arg, "colors", 1) || keymatch(arg, "colours", 1) ||
               keymatch(arg, "quantize", 1) || keymatch(arg, "quantise", 1)) {
      /* Do color quantization. */
      int val;

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%d", &val) != 1)
        usage();
      cinfo->desired_number_of_colors = val;
      cinfo->quantize_colors = TRUE;

    } else if (keymatch(arg, "dct", 2)) {
      /* Select IDCT algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "int", 1)) {
        cinfo->dct_method = JDCT_ISLOW;
      } else if (keymatch(argv[argn], "fast", 2)) {
        cinfo->dct_method = JDCT_IFAST;
      } else if (keymatch(argv[argn], "float", 2)) {
        cinfo->dct_method = JDCT_FLOAT;
      } else
        usage();

    } else if (keymatch(arg, "dither", 2)) {
      /* Select dithering algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "fs", 2)) {
        cinfo->dither_mode = JDITHER_FS;
      } else if (keymatch(argv[argn], "none", 2)) {
        cinfo->dither_mode = JDITHER_NONE;
      } else if (keymatch(argv[argn], "ordered", 2)) {
        cinfo->dither_mode = JDITHER_ORDERED;
      } else
        usage();

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "fast", 1)) {
      /* Select recommended processing options for quick-and-dirty output. */
      cinfo->two_pass_quantize = FALSE;
      cinfo->dither_mode = JDITHER_ORDERED;
      if (!cinfo->quantize_colors) /* don't override an earlier -colors */
        cinfo->desired_number_of_colors = 216;
      cinfo->dct_method = JDCT_FASTEST;
      cinfo->do_fancy_upsampling = FALSE;

    } else if (keymatch(arg, "gif", 1)) {
      /* GIF output format (LZW-compressed). */
      requested_fmt = FMT_GIF;

    } else if (keymatch(arg, "gif0", 4)) {
      /* GIF output format (uncompressed). */
      requested_fmt = FMT_GIF0;

    } else if (keymatch(arg, "grayscale", 2) ||
               keymatch(arg, "greyscale", 2)) {
      /* Force monochrome output. */
      cinfo->out_color_space = JCS_GRAYSCALE;

    } else if (keymatch(arg, "rgb", 2)) {
      /* Force RGB output. */
      cinfo->out_color_space = JCS_RGB;

    } else if (keymatch(arg, "rgb565", 2)) {
      /* Force RGB565 output. */
      cinfo->out_color_space = JCS_RGB565;

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];
      jpeg_save_markers(cinfo, JPEG_APP0 + 2, 0xFFFF);

    } else if (keymatch(arg, "map", 3)) {
      /* Quantize to a color map taken from an input file. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (for_real) {           /* too expensive to do twice! */
#ifdef QUANT_2PASS_SUPPORTED    /* otherwise can't quantize to supplied map */
        FILE *mapfile;

        if ((mapfile = fopen(argv[argn], READ_BINARY)) == NULL) {
          fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
          exit(EXIT_FAILURE);
        }
        read_color_map(cinfo, mapfile);
        fclose(mapfile);
        cinfo->quantize_colors = TRUE;
#else
        ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
      }

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "nosmooth", 3)) {
      /* Suppress fancy upsampling */
      cinfo->do_fancy_upsampling = FALSE;

    } else if (keymatch(arg, "onepass", 3)) {
      /* Use fast one-pass quantization. */
      cinfo->two_pass_quantize = FALSE;

    } else if (keymatch(arg, "os2", 3)) {
      /* BMP output format (OS/2 flavor). */
      requested_fmt = FMT_OS2;

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "memsrc", 2)) {
      /* Use in-memory source manager */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
      memsrc = TRUE;
#else
      fprintf(stderr, "%s: sorry, in-memory source manager was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "pnm", 1) || keymatch(arg, "ppm", 1)) {
      /* PPM/PGM output format. */
      requested_fmt = FMT_PPM;

    } else if (keymatch(arg, "report", 2)) {
      report = TRUE;

    } else if (keymatch(arg, "scale", 2)) {
      /* Scale the output image by a fraction M/N. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u/%u",
                 &cinfo->scale_num, &cinfo->scale_denom) != 2)
        usage();

    } else if (keymatch(arg, "skip", 2)) {
      if (++argn >= argc)
        usage();
      if (sscanf(argv[argn], "%u,%u", &skip_start, &skip_end) != 2 ||
          skip_start > skip_end)
        usage();
      skip = TRUE;

    } else if (keymatch(arg, "crop", 2)) {
      char c;
      if (++argn >= argc)
        usage();
      if (sscanf(argv[argn], "%u%c%u+%u+%u", &crop_width, &c, &crop_height,
                 &crop_x, &crop_y) != 5 ||
          (c != 'X' && c != 'x') || crop_width < 1 || crop_height < 1)
        usage();
      crop = TRUE;

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "targa", 1)) {
      /* Targa output format. */
      requested_fmt = FMT_TARGA;

    } else {
      usage();                  /* bogus switch */
    }
  }

  return argn;                  /* return index of next arg (file name) */
}